

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr
          (ExceptionOr<kj::AuthenticatedStream> *this)

{
  NullableValue<kj::AuthenticatedStream>::~NullableValue(&(this->value).ptr);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr() = default;